

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPtrAbc.c
# Opt level: O0

char * Ptr_AbcObjName(Abc_Obj_t *pObj)

{
  int iVar1;
  char *pcVar2;
  Abc_Obj_t *pAVar3;
  Abc_Obj_t *pObj_local;
  
  iVar1 = Abc_ObjIsNet(pObj);
  if ((iVar1 != 0) || (iVar1 = Abc_ObjIsBox(pObj), iVar1 != 0)) {
    pcVar2 = Abc_ObjName(pObj);
    return pcVar2;
  }
  iVar1 = Abc_ObjIsCi(pObj);
  if ((iVar1 == 0) && (iVar1 = Abc_ObjIsNode(pObj), iVar1 == 0)) {
    iVar1 = Abc_ObjIsCo(pObj);
    if (iVar1 != 0) {
      pAVar3 = Abc_ObjFanin0(pObj);
      pcVar2 = Ptr_AbcObjName(pAVar3);
      return pcVar2;
    }
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bacPtrAbc.c"
                  ,0x66,"char *Ptr_AbcObjName(Abc_Obj_t *)");
  }
  pAVar3 = Abc_ObjFanout0(pObj);
  pcVar2 = Ptr_AbcObjName(pAVar3);
  return pcVar2;
}

Assistant:

char * Ptr_AbcObjName( Abc_Obj_t * pObj )
{
    if ( Abc_ObjIsNet(pObj) || Abc_ObjIsBox(pObj) )
        return Abc_ObjName(pObj);
    if ( Abc_ObjIsCi(pObj) || Abc_ObjIsNode(pObj) )
        return Ptr_AbcObjName(Abc_ObjFanout0(pObj));
    if ( Abc_ObjIsCo(pObj) )
        return Ptr_AbcObjName(Abc_ObjFanin0(pObj));
    assert( 0 );
    return NULL;
}